

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns_handler.cpp
# Opt level: O3

int ot::commissioner::HandleRecord
              (sockaddr *aFrom,mdns_entry_type_t aEntry,uint16_t aType,uint16_t aRclass,
              uint32_t aTtl,void *aData,size_t aSize,size_t aOffset,size_t aLength,
              void *aBorderAgent)

{
  char cVar1;
  byte bVar2;
  ushort uVar3;
  bool bVar4;
  undefined4 uVar5;
  unsigned_short uVar6;
  int iVar7;
  uint uVar8;
  char *pcVar9;
  size_t sVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  unsigned_long uVar12;
  Timestamp TVar13;
  time_t tVar14;
  ByteArray *extraout_RDX;
  ByteArray *extraout_RDX_00;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ByteArray *extraout_RDX_01;
  ByteArray *extraout_RDX_02;
  ByteArray *pBVar18;
  ByteArray *aBytes;
  ByteArray *aBytes_00;
  ByteArray *aBytes_01;
  ByteArray *aBytes_02;
  ByteArray *aBytes_03;
  ByteArray *aBytes_04;
  long lVar19;
  _Alloc_hider _Var20;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar21;
  size_t sVar22;
  char *pcVar23;
  char *__s;
  mdns_string_t mVar24;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  string_view fmt_06;
  string_view fmt_07;
  string_view fmt_08;
  string_view fmt_09;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  format_args args_08;
  format_args args_09;
  format_args args_10;
  writer write_1;
  ByteArray binaryValue;
  string value;
  writer write;
  string fromAddrStr;
  Address fromAddr;
  string entryType;
  char nameBuffer [256];
  sockaddr_storage fromAddrStorage;
  mdns_record_srv_t server;
  undefined1 local_1368 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1358;
  undefined1 local_1348 [8];
  char *pcStack_1340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1328;
  code *local_1320;
  code *local_1318;
  string local_1308;
  string *local_12e8;
  ByteArray local_12e0;
  undefined1 local_12c8 [8];
  char *pcStack_12c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_12b8 [2];
  string local_1298;
  writer local_1278;
  undefined8 local_1270;
  undefined1 local_1268 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1258;
  char *pcStack_1250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1248;
  Address local_1238;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_1220;
  string *local_1218;
  string *local_1210;
  string *local_1208;
  string *local_1200;
  string *local_11f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_11f0;
  string *local_11e8;
  size_t local_11e0;
  undefined1 *local_11d8;
  char *local_11d0;
  undefined1 local_11c8 [16];
  char local_11b8 [256];
  sockaddr_storage local_10b8;
  undefined1 local_1038 [24];
  long lStack_1020;
  format_string_checker<char> *local_1018;
  parse_func local_1010 [1];
  
  local_1238.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1238.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1238.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1258 = &local_1248;
  pcStack_1250 = (char *)0x0;
  local_1248._M_local_buf[0] = '\0';
  local_11d8 = local_11c8;
  local_11d0 = (char *)0x0;
  local_11c8[0] = 0;
  local_10b8.ss_family = aFrom->sa_family;
  local_10b8.__ss_padding[0] = aFrom->sa_data[0];
  local_10b8.__ss_padding[1] = aFrom->sa_data[1];
  local_10b8.__ss_padding[2] = aFrom->sa_data[2];
  local_10b8.__ss_padding[3] = aFrom->sa_data[3];
  local_10b8.__ss_padding[4] = aFrom->sa_data[4];
  local_10b8.__ss_padding[5] = aFrom->sa_data[5];
  local_10b8.__ss_padding._6_8_ = *(undefined8 *)(aFrom->sa_data + 6);
  aVar21 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
            )aData;
  Address::Set((Error *)local_1038,&local_1238,&local_10b8);
  uVar5 = local_1038._0_4_;
  if ((long *)CONCAT44(local_1038._12_4_,local_1038._8_4_) != &lStack_1020) {
    operator_delete((long *)CONCAT44(local_1038._12_4_,local_1038._8_4_));
  }
  if (uVar5 != none_type) {
    local_1038._0_8_ = local_1038._0_8_ & 0xffffffff00000000;
    pcVar9 = "invalid source address of mDNS response";
    local_1038._8_4_ = 0x2663f3;
    local_1038._12_4_ = 0;
    local_1038._16_4_ = 0x27;
    local_1038._20_4_ = 0;
    lStack_1020._0_4_ = 0;
    lStack_1020._4_4_ = 0;
    local_1010[0] = (parse_func)0x0;
    local_1278.handler_ = (format_string_checker<char> *)local_1038;
    local_1018 = (format_string_checker<char> *)local_1038;
    do {
      cVar1 = *pcVar9;
      pcVar23 = pcVar9;
      while (cVar1 != '{') {
        pcVar23 = pcVar23 + 1;
        if (pcVar23 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&local_1278,pcVar9,"");
          goto LAB_001f86c1;
        }
        cVar1 = *pcVar23;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&local_1278,pcVar9,pcVar23);
      pcVar9 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar23,"",(format_string_checker<char> *)local_1038);
    } while (pcVar9 != "");
LAB_001f86c1:
    args.field_1.args_ = aVar21.args_;
    args.desc_ = (unsigned_long_long)local_1038;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)local_12c8,(v10 *)"invalid source address of mDNS response",
               (string_view)ZEXT816(0x27),args);
    local_1348._0_4_ = 8;
    pcStack_1340 = local_1338._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pcStack_1340,local_12c8,pcStack_12c0 + (long)local_12c8);
    *(undefined4 *)((long)aBorderAgent + 0x178) = local_1348._0_4_;
    std::__cxx11::string::operator=((string *)((long)aBorderAgent + 0x180),(string *)&pcStack_1340);
    if (pcStack_1340 != local_1338._M_local_buf + 8) {
      operator_delete(pcStack_1340);
    }
    if (local_12c8 != (undefined1  [8])local_12b8) {
      operator_delete((void *)local_12c8);
    }
    goto LAB_001f9bfb;
  }
  Address::ToString_abi_cxx11_((string *)local_1038,&local_1238);
  std::__cxx11::string::operator=((string *)&local_1258,(string *)local_1038);
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_1038 + 0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1038._0_8_ != paVar11) {
    operator_delete((void *)local_1038._0_8_);
  }
  pcVar9 = local_11d0;
  pcVar23 = "additional";
  if (aEntry == MDNS_ENTRYTYPE_AUTHORITY) {
    pcVar23 = "authority";
  }
  __s = "answer";
  if (aEntry != MDNS_ENTRYTYPE_ANSWER) {
    __s = pcVar23;
  }
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&local_11d8,0,pcVar9,(ulong)__s);
  if (aType < 0x10) {
    if (aType == 1) {
      local_1278.handler_ = (format_string_checker<char> *)local_1268;
      local_1270 = 0;
      local_1268[0] = none_type;
      mdns_record_parse_a(aData,aSize,aOffset,aLength,(sockaddr_in *)local_1368);
      local_1038._0_8_ = local_1368._0_8_;
      local_1038._8_4_ = local_1368._8_4_;
      local_1038._12_4_ = local_1368._12_4_;
      Address::Set((Error *)local_1348,&local_1238,(sockaddr_storage *)local_1038);
      iVar7 = local_1348._0_4_;
      if (pcStack_1340 != local_1338._M_local_buf + 8) {
        operator_delete(pcStack_1340);
      }
      if (iVar7 == 0) {
        Address::ToString_abi_cxx11_((string *)local_1348,&local_1238);
        std::__cxx11::string::operator=((string *)&local_1278,(string *)local_1348);
        if (local_1348 != (undefined1  [8])&local_1338) {
          operator_delete((void *)local_1348);
        }
        if ((*(byte *)((long)aBorderAgent + 0x170) & 1) == 0) {
          std::__cxx11::string::_M_assign((string *)((long)aBorderAgent + 8));
          goto LAB_001f9ba8;
        }
      }
      else {
        local_1348._0_4_ = 0xd;
        pcVar9 = "invalid IPv4 address in A record from {}";
        pcStack_1340 = "invalid IPv4 address in A record from {}";
        local_1338._M_allocated_capacity = 0x28;
        local_1338._8_8_ = (char *)0x100000000;
        local_1320 = ::fmt::v10::detail::
                     parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
        ;
        local_1328 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_1348;
        local_1308._M_dataplus._M_p = (pointer)local_1348;
        do {
          cVar1 = *pcVar9;
          pcVar23 = pcVar9;
          while (cVar1 != '{') {
            pcVar23 = pcVar23 + 1;
            if (pcVar23 == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::writer::operator()((writer *)&local_1308,pcVar9,"");
              goto LAB_001f9a36;
            }
            cVar1 = *pcVar23;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()((writer *)&local_1308,pcVar9,pcVar23);
          pcVar9 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (pcVar23,"",(format_string_checker<char> *)local_1348);
        } while (pcVar9 != "");
LAB_001f9a36:
        local_1348 = (undefined1  [8])local_1258;
        pcStack_1340 = pcStack_1250;
        fmt_09.size_ = 0xd;
        fmt_09.data_ = (char *)0x28;
        args_10.field_1.args_ = aVar21.args_;
        args_10.desc_ = (unsigned_long_long)local_1348;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_1298,(v10 *)"invalid IPv4 address in A record from {}",fmt_09,args_10);
        local_12c8._0_4_ = 8;
        pcStack_12c0 = local_12b8[0]._M_local_buf + 8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pcStack_12c0,local_1298._M_dataplus._M_p,
                   (char *)(local_1298._M_string_length + (long)local_1298._M_dataplus._M_p));
LAB_001f9aa4:
        *(undefined4 *)((long)aBorderAgent + 0x178) = local_12c8._0_4_;
        std::__cxx11::string::operator=
                  ((string *)((long)aBorderAgent + 0x180),(string *)&pcStack_12c0);
        if (pcStack_12c0 != local_12b8[0]._M_local_buf + 8) {
          operator_delete(pcStack_12c0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1298._M_dataplus._M_p != &local_1298.field_2) {
          operator_delete(local_1298._M_dataplus._M_p);
        }
      }
LAB_001f9bb7:
      if (local_1278.handler_ != (format_string_checker<char> *)local_1268) {
        operator_delete(local_1278.handler_);
      }
      if (iVar7 != 0) goto LAB_001f9bfb;
    }
    else if (aType == 0xc) {
      mVar24 = mdns_record_parse_ptr(aData,aSize,aOffset,aLength,local_11b8,0x100);
      local_1038._0_8_ = paVar11;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1038,mVar24.str,mVar24.str + mVar24.length);
      std::__cxx11::string::operator=((string *)((long)aBorderAgent + 0x148),(string *)local_1038);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1038._0_8_ != paVar11) {
        operator_delete((void *)local_1038._0_8_);
      }
      *(undefined4 *)((long)aBorderAgent + 0x170) = 0x10000;
    }
  }
  else if (aType == 0x10) {
    aVar21 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
              )0x80;
    sVar10 = mdns_record_parse_txt(aData,aSize,aOffset,aLength,(mdns_record_txt_t *)local_1038,0x80)
    ;
    if (sVar10 != 0) {
      local_12e8 = (string *)((long)aBorderAgent + 0x180);
      local_1218 = (string *)((long)aBorderAgent + 0x120);
      local_1220 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   ((long)aBorderAgent + 0x108);
      local_1210 = (string *)((long)aBorderAgent + 0xe8);
      local_1208 = (string *)((long)aBorderAgent + 0xb8);
      local_1200 = (string *)((long)aBorderAgent + 0x98);
      local_11f8 = (string *)((long)aBorderAgent + 0x70);
      local_11e8 = (string *)((long)aBorderAgent + 0x48);
      local_11f0 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   ((long)aBorderAgent + 0x30);
      sVar22 = 0;
      local_11e0 = sVar10;
      do {
        lVar19 = sVar22 * 0x20;
        local_1278.handler_ = (format_string_checker<char> *)local_1268;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1278,*(long *)(local_1038 + lVar19),
                   *(long *)(local_1038 + lVar19 + 8) + *(long *)(local_1038 + lVar19));
        local_1298._M_dataplus._M_p = (pointer)&local_1298.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1298,*(long *)(local_1038 + lVar19 + 0x10),
                   (&lStack_1020)[sVar22 * 4] + *(long *)(local_1038 + lVar19 + 0x10));
        std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<char_const*,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_12e0,
                   *(char **)(local_1038 + lVar19 + 0x10),
                   *(char **)(local_1038 + lVar19 + 0x10) + (&lStack_1020)[sVar22 * 4],
                   (allocator_type *)local_1348);
        iVar7 = std::__cxx11::string::compare((char *)&local_1278);
        if (iVar7 == 0) {
          iVar7 = std::__cxx11::string::compare((char *)&local_1298);
          if (iVar7 == 0) goto LAB_001f95d7;
          local_1348 = (undefined1  [8])0xd0000000d;
          pcStack_1340 = "value of TXT Key \'rv\' is {} but not 1 from {}";
          local_1338._M_allocated_capacity = 0x2d;
          local_1338._8_8_ = 0x200000000;
          local_1328 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_1348;
          local_1320 = ::fmt::v10::detail::
                       parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
          ;
          local_1318 = ::fmt::v10::detail::
                       parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
          ;
          pcVar9 = "value of TXT Key \'rv\' is {} but not 1 from {}";
          local_1308._M_dataplus._M_p = (pointer)local_1328;
          do {
            cVar1 = *pcVar9;
            pcVar23 = pcVar9;
            while (cVar1 != '{') {
              pcVar23 = pcVar23 + 1;
              if (pcVar23 == "") {
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::writer::operator()((writer *)&local_1308,pcVar9,"");
                goto LAB_001f8cfa;
              }
              cVar1 = *pcVar23;
            }
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()((writer *)&local_1308,pcVar9,pcVar23);
            pcVar9 = ::fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,std::__cxx11::string>&>
                               (pcVar23,"",
                                (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_1348);
          } while (pcVar9 != "");
LAB_001f8cfa:
          local_1348 = (undefined1  [8])local_1298._M_dataplus._M_p;
          pcStack_1340 = (char *)local_1298._M_string_length;
          local_1338._M_allocated_capacity = (size_type)local_1258;
          local_1338._8_8_ = pcStack_1250;
          fmt.size_ = 0xdd;
          fmt.data_ = (char *)0x2d;
          args_00.field_1.args_ = aVar21.args_;
          args_00.desc_ = (unsigned_long_long)local_1348;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)local_1368,(v10 *)"value of TXT Key \'rv\' is {} but not 1 from {}",
                     fmt,args_00);
          local_12c8._0_4_ = 8;
          pcStack_12c0 = local_12b8[0]._M_local_buf + 8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&pcStack_12c0,local_1368._0_8_,
                     (char *)(local_1368._0_8_ + CONCAT44(local_1368._12_4_,local_1368._8_4_)));
          *(undefined4 *)((long)aBorderAgent + 0x178) = local_12c8._0_4_;
          std::__cxx11::string::operator=(local_12e8,(string *)&pcStack_12c0);
          if (pcStack_12c0 != local_12b8[0]._M_local_buf + 8) {
            operator_delete(pcStack_12c0);
          }
          paVar11 = &local_1358;
          _Var20._M_p = (pointer)local_1368._0_8_;
LAB_001f918d:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var20._M_p != paVar11) {
            operator_delete(_Var20._M_p);
          }
          bVar4 = false;
        }
        else {
          iVar7 = std::__cxx11::string::compare((char *)&local_1278);
          if (iVar7 == 0) {
            if ((long)local_12e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_12e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start != 8) {
              local_1348._0_4_ = 0xd;
              pcStack_1340 = "value of TXT Key \'dd\' is invalid: value={}";
              local_1338._M_allocated_capacity = 0x2a;
              local_1338._8_8_ = (char *)0x100000000;
              local_1328 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)local_1348;
              local_1320 = ::fmt::v10::detail::
                           parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
              ;
              pcVar9 = "value of TXT Key \'dd\' is invalid: value={}";
              local_1308._M_dataplus._M_p = (pointer)local_1328;
              do {
                cVar1 = *pcVar9;
                pcVar23 = pcVar9;
                while (cVar1 != '{') {
                  pcVar23 = pcVar23 + 1;
                  if (pcVar23 == "") {
                    ::fmt::v10::detail::
                    parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::writer::operator()((writer *)&local_1308,pcVar9,"");
                    pBVar18 = extraout_RDX_00;
                    goto LAB_001f8e82;
                  }
                  cVar1 = *pcVar23;
                }
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::writer::operator()((writer *)&local_1308,pcVar9,pcVar23);
                pcVar9 = ::fmt::v10::detail::
                         parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                   (pcVar23,"",(format_string_checker<char> *)local_1348);
                pBVar18 = extraout_RDX;
              } while (pcVar9 != "");
LAB_001f8e82:
              utils::Hex_abi_cxx11_((string *)local_1348,(utils *)&local_12e0,pBVar18);
              local_1308._M_dataplus._M_p = (pointer)local_1348;
              local_1308._M_string_length = (size_type)pcStack_1340;
              fmt_00.size_ = 0xd;
              fmt_00.data_ = (char *)0x2a;
              args_01.field_1.args_ = aVar21.args_;
              args_01.desc_ = (unsigned_long_long)&local_1308;
              ::fmt::v10::vformat_abi_cxx11_
                        ((string *)local_1368,(v10 *)"value of TXT Key \'dd\' is invalid: value={}",
                         fmt_00,args_01);
              local_12c8._0_4_ = 8;
              pcStack_12c0 = local_12b8[0]._M_local_buf + 8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&pcStack_12c0,local_1368._0_8_,
                         (char *)(local_1368._0_8_ + CONCAT44(local_1368._12_4_,local_1368._8_4_)));
              *(undefined4 *)((long)aBorderAgent + 0x178) = local_12c8._0_4_;
              std::__cxx11::string::operator=(local_12e8,(string *)&pcStack_12c0);
              if (pcStack_12c0 != local_12b8[0]._M_local_buf + 8) {
                operator_delete(pcStack_12c0);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1368._0_8_ != &local_1358) {
                operator_delete((void *)local_1368._0_8_);
              }
              paVar11 = &local_1338;
              _Var20._M_p = (pointer)local_1348;
              goto LAB_001f918d;
            }
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                      (local_11f0,&local_12e0);
            *(byte *)((long)aBorderAgent + 0x171) = *(byte *)((long)aBorderAgent + 0x171) | 0x80;
          }
          else {
            iVar7 = std::__cxx11::string::compare((char *)&local_1278);
            if (iVar7 == 0) {
              std::__cxx11::string::_M_assign(local_11e8);
              *(byte *)((long)aBorderAgent + 0x170) = *(byte *)((long)aBorderAgent + 0x170) | 4;
            }
            else {
              iVar7 = std::__cxx11::string::compare((char *)&local_1278);
              if (iVar7 == 0) {
                if ((long)local_12e0.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_12e0.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start != 4) {
                  local_1348 = (undefined1  [8])0xd0000000d;
                  pcStack_1340 = "value of TXT Key \'sb\' is invalid: value={} from {}";
                  local_1338._M_allocated_capacity = 0x32;
                  local_1338._8_8_ = 0x200000000;
                  local_1328 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)local_1348;
                  local_1320 = ::fmt::v10::detail::
                               parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
                  ;
                  local_1318 = ::fmt::v10::detail::
                               parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
                  ;
                  pcVar9 = "value of TXT Key \'sb\' is invalid: value={} from {}";
                  local_1308._M_dataplus._M_p = (pointer)local_1328;
                  do {
                    cVar1 = *pcVar9;
                    pcVar23 = pcVar9;
                    while (cVar1 != '{') {
                      pcVar23 = pcVar23 + 1;
                      if (pcVar23 == "") {
                        ::fmt::v10::detail::
                        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::writer::operator()((writer *)&local_1308,pcVar9,"");
                        pBVar18 = extraout_RDX_02;
                        goto LAB_001f90b4;
                      }
                      cVar1 = *pcVar23;
                    }
                    ::fmt::v10::detail::
                    parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::writer::operator()((writer *)&local_1308,pcVar9,pcVar23);
                    pcVar9 = ::fmt::v10::detail::
                             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,std::__cxx11::string>&>
                                       (pcVar23,"",
                                        (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)local_1348);
                    pBVar18 = extraout_RDX_01;
                  } while (pcVar9 != "");
LAB_001f90b4:
                  utils::Hex_abi_cxx11_(&local_1308,(utils *)&local_12e0,pBVar18);
                  local_1348 = (undefined1  [8])local_1308._M_dataplus._M_p;
                  pcStack_1340 = (char *)local_1308._M_string_length;
                  local_1338._M_allocated_capacity = (size_type)local_1258;
                  local_1338._8_8_ = pcStack_1250;
                  fmt_01.size_ = 0xdd;
                  fmt_01.data_ = (char *)0x32;
                  args_02.field_1.args_ = aVar21.args_;
                  args_02.desc_ = (unsigned_long_long)local_1348;
                  ::fmt::v10::vformat_abi_cxx11_
                            ((string *)local_1368,
                             (v10 *)"value of TXT Key \'sb\' is invalid: value={} from {}",fmt_01,
                             args_02);
                  local_12c8._0_4_ = 8;
                  pcStack_12c0 = local_12b8[0]._M_local_buf + 8;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&pcStack_12c0,local_1368._0_8_,
                             (char *)(local_1368._0_8_ +
                                     CONCAT44(local_1368._12_4_,local_1368._8_4_)));
                  *(undefined4 *)((long)aBorderAgent + 0x178) = local_12c8._0_4_;
                  std::__cxx11::string::operator=(local_12e8,(string *)&pcStack_12c0);
                  pcVar9 = pcStack_12c0;
                  if (pcStack_12c0 != local_12b8[0]._M_local_buf + 8) {
LAB_001f9167:
                    operator_delete(pcVar9);
                  }
LAB_001f916c:
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1368._0_8_ != &local_1358) {
                    operator_delete((void *)local_1368._0_8_);
                  }
                  paVar11 = &local_1308.field_2;
                  _Var20._M_p = local_1308._M_dataplus._M_p;
                  goto LAB_001f918d;
                }
                uVar15 = local_12e0.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start[3] & 7;
                uVar3 = (ushort)*(undefined4 *)((long)aBorderAgent + 0x68);
                *(ushort *)((long)aBorderAgent + 0x68) = uVar3 & 0xfff8 | uVar15;
                uVar16 = local_12e0.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start[3] & 0x18;
                *(ushort *)((long)aBorderAgent + 0x68) = uVar3 & 0xffe0 | uVar15 | uVar16;
                uVar17 = local_12e0.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start[3] & 0x60;
                *(ushort *)((long)aBorderAgent + 0x68) = uVar3 & 0xff80 | uVar15 | uVar16 | uVar17;
                bVar2 = local_12e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_start[3];
                *(ushort *)((long)aBorderAgent + 0x68) =
                     uVar3 & 0xff00 | uVar15 | uVar16 | uVar17 | bVar2 & 0xff80;
                *(ushort *)((long)aBorderAgent + 0x68) =
                     uVar3 & 0xfe00 | uVar15 | uVar16 | uVar17 | bVar2 & 0xff80 |
                     (local_12e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start[2] & 1) << 8;
                *(byte *)((long)aBorderAgent + 0x170) = *(byte *)((long)aBorderAgent + 0x170) | 8;
              }
              else {
                iVar7 = std::__cxx11::string::compare((char *)&local_1278);
                if (iVar7 == 0) {
                  std::__cxx11::string::_M_assign(local_11f8);
                  *(byte *)((long)aBorderAgent + 0x170) =
                       *(byte *)((long)aBorderAgent + 0x170) | 0x10;
                }
                else {
                  iVar7 = std::__cxx11::string::compare((char *)&local_1278);
                  if (iVar7 == 0) {
                    if ((long)local_12e0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_12e0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start != 8) {
                      ::fmt::v10::detail::
                      check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                                ();
                      utils::Hex_abi_cxx11_(&local_1308,(utils *)&local_12e0,aBytes);
                      local_12c8 = (undefined1  [8])local_1308._M_dataplus._M_p;
                      pcStack_12c0 = (char *)local_1308._M_string_length;
                      local_12b8[0]._M_allocated_capacity = local_1258;
                      local_12b8[0]._8_8_ = pcStack_1250;
                      fmt_02.size_ = 0xdd;
                      fmt_02.data_ = (char *)0x32;
                      args_03.field_1.args_ = aVar21.args_;
                      args_03.desc_ = (unsigned_long_long)local_12c8;
                      ::fmt::v10::vformat_abi_cxx11_
                                ((string *)local_1368,
                                 (v10 *)"value of TXT Key \'xp\' is invalid: value={} from {}",
                                 fmt_02,args_03);
                      local_1348._0_4_ = 8;
                      pcStack_1340 = local_1338._M_local_buf + 8;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&pcStack_1340,local_1368._0_8_,
                                 (char *)(local_1368._0_8_ +
                                         CONCAT44(local_1368._12_4_,local_1368._8_4_)));
                      goto LAB_001f9289;
                    }
                    uVar12 = utils::Decode<unsigned_long>
                                       (local_12e0.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start,8);
                    *(unsigned_long *)((long)aBorderAgent + 0x90) = uVar12;
                    *(byte *)((long)aBorderAgent + 0x170) =
                         *(byte *)((long)aBorderAgent + 0x170) | 0x20;
                  }
                  else {
                    iVar7 = std::__cxx11::string::compare((char *)&local_1278);
                    if (iVar7 == 0) {
                      std::__cxx11::string::_M_assign(local_1200);
                      *(byte *)((long)aBorderAgent + 0x170) =
                           *(byte *)((long)aBorderAgent + 0x170) | 0x40;
                    }
                    else {
                      iVar7 = std::__cxx11::string::compare((char *)&local_1278);
                      if (iVar7 == 0) {
                        std::__cxx11::string::_M_assign(local_1208);
                        *(byte *)((long)aBorderAgent + 0x170) =
                             *(byte *)((long)aBorderAgent + 0x170) | 0x80;
                      }
                      else {
                        iVar7 = std::__cxx11::string::compare((char *)&local_1278);
                        if (iVar7 == 0) {
                          if ((long)local_12e0.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_12e0.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start != 8) {
                            ::fmt::v10::detail::
                            check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                                      ();
                            utils::Hex_abi_cxx11_(&local_1308,(utils *)&local_12e0,aBytes_00);
                            local_12c8 = (undefined1  [8])local_1308._M_dataplus._M_p;
                            pcStack_12c0 = (char *)local_1308._M_string_length;
                            local_12b8[0]._M_allocated_capacity = local_1258;
                            local_12b8[0]._8_8_ = pcStack_1250;
                            fmt_03.size_ = 0xdd;
                            fmt_03.data_ = (char *)0x32;
                            args_04.field_1.args_ = aVar21.args_;
                            args_04.desc_ = (unsigned_long_long)local_12c8;
                            ::fmt::v10::vformat_abi_cxx11_
                                      ((string *)local_1368,
                                       (v10 *)"value of TXT Key \'at\' is invalid: value={} from {}"
                                       ,fmt_03,args_04);
                            local_1348._0_4_ = 8;
                            pcStack_1340 = local_1338._M_local_buf + 8;
                            std::__cxx11::string::_M_construct<char*>
                                      ((string *)&pcStack_1340,local_1368._0_8_,
                                       (char *)(local_1368._0_8_ +
                                               CONCAT44(local_1368._12_4_,local_1368._8_4_)));
LAB_001f9289:
                            *(undefined4 *)((long)aBorderAgent + 0x178) = local_1348._0_4_;
                            std::__cxx11::string::operator=(local_12e8,(string *)&pcStack_1340);
                            pcVar9 = pcStack_1340;
                            if (pcStack_1340 != local_1338._M_local_buf + 8) goto LAB_001f9167;
                            goto LAB_001f916c;
                          }
                          uVar12 = utils::Decode<unsigned_long>
                                             (local_12e0.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start,8);
                          TVar13 = Timestamp::Decode(uVar12);
                          *(Timestamp *)((long)aBorderAgent + 0xd8) = TVar13;
                          *(byte *)((long)aBorderAgent + 0x171) =
                               *(byte *)((long)aBorderAgent + 0x171) | 1;
                        }
                        else {
                          iVar7 = std::__cxx11::string::compare((char *)&local_1278);
                          if (iVar7 == 0) {
                            if ((long)local_12e0.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_12e0.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start != 4) {
                              ::fmt::v10::detail::
                              check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                                        ();
                              utils::Hex_abi_cxx11_(&local_1308,(utils *)&local_12e0,aBytes_01);
                              local_12c8 = (undefined1  [8])local_1308._M_dataplus._M_p;
                              pcStack_12c0 = (char *)local_1308._M_string_length;
                              local_12b8[0]._M_allocated_capacity = local_1258;
                              local_12b8[0]._8_8_ = pcStack_1250;
                              fmt_04.size_ = 0xdd;
                              fmt_04.data_ = (char *)0x32;
                              args_05.field_1.args_ = aVar21.args_;
                              args_05.desc_ = (unsigned_long_long)local_12c8;
                              ::fmt::v10::vformat_abi_cxx11_
                                        ((string *)local_1368,
                                         (v10 *)
                                         "value of TXT Key \'pt\' is invalid: value={} from {}",
                                         fmt_04,args_05);
                              local_1348._0_4_ = 8;
                              pcStack_1340 = local_1338._M_local_buf + 8;
                              std::__cxx11::string::_M_construct<char*>
                                        ((string *)&pcStack_1340,local_1368._0_8_,
                                         (char *)(local_1368._0_8_ +
                                                 CONCAT44(local_1368._12_4_,local_1368._8_4_)));
                              goto LAB_001f9289;
                            }
                            uVar8 = utils::Decode<unsigned_int>
                                              (local_12e0.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start,4);
                            *(uint *)((long)aBorderAgent + 0xe0) = uVar8;
                            *(byte *)((long)aBorderAgent + 0x171) =
                                 *(byte *)((long)aBorderAgent + 0x171) | 2;
                          }
                          else {
                            iVar7 = std::__cxx11::string::compare((char *)&local_1278);
                            if (iVar7 == 0) {
                              std::__cxx11::string::_M_assign(local_1210);
                              *(byte *)((long)aBorderAgent + 0x171) =
                                   *(byte *)((long)aBorderAgent + 0x171) | 4;
                            }
                            else {
                              iVar7 = std::__cxx11::string::compare((char *)&local_1278);
                              if (iVar7 == 0) {
                                if ((long)local_12e0.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_12e0.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start != 3) {
                                  ::fmt::v10::detail::
                                  check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                                            ();
                                  utils::Hex_abi_cxx11_(&local_1308,(utils *)&local_12e0,aBytes_02);
                                  local_12c8 = (undefined1  [8])local_1308._M_dataplus._M_p;
                                  pcStack_12c0 = (char *)local_1308._M_string_length;
                                  local_12b8[0]._M_allocated_capacity = local_1258;
                                  local_12b8[0]._8_8_ = pcStack_1250;
                                  fmt_05.size_ = 0xdd;
                                  fmt_05.data_ = (char *)0x32;
                                  args_06.field_1.args_ = aVar21.args_;
                                  args_06.desc_ = (unsigned_long_long)local_12c8;
                                  ::fmt::v10::vformat_abi_cxx11_
                                            ((string *)local_1368,
                                             (v10 *)
                                             "value of TXT Key \'vo\' is invalid: value={} from {}",
                                             fmt_05,args_06);
                                  local_1348._0_4_ = 8;
                                  pcStack_1340 = local_1338._M_local_buf + 8;
                                  std::__cxx11::string::_M_construct<char*>
                                            ((string *)&pcStack_1340,local_1368._0_8_,
                                             (char *)(local_1368._0_8_ +
                                                     CONCAT44(local_1368._12_4_,local_1368._8_4_)));
                                  goto LAB_001f9289;
                                }
                                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                operator=(local_1220,&local_12e0);
                                *(byte *)((long)aBorderAgent + 0x171) =
                                     *(byte *)((long)aBorderAgent + 0x171) | 8;
                              }
                              else {
                                iVar7 = std::__cxx11::string::compare((char *)&local_1278);
                                if (iVar7 == 0) {
                                  std::__cxx11::string::_M_assign(local_1218);
                                  *(byte *)((long)aBorderAgent + 0x171) =
                                       *(byte *)((long)aBorderAgent + 0x171) | 0x10;
                                }
                                else {
                                  iVar7 = std::__cxx11::string::compare((char *)&local_1278);
                                  if (iVar7 != 0) {
                                    iVar7 = std::__cxx11::string::compare((char *)&local_1278);
                                    bVar4 = true;
                                    if (iVar7 == 0) {
                                      if ((long)local_12e0.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_12e0.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start != 2) {
                                        ::fmt::v10::detail::
                                        check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                                                  ();
                                        utils::Hex_abi_cxx11_
                                                  (&local_1308,(utils *)&local_12e0,aBytes_04);
                                        local_12c8 = (undefined1  [8])local_1308._M_dataplus._M_p;
                                        pcStack_12c0 = (char *)local_1308._M_string_length;
                                        local_12b8[0]._M_allocated_capacity = local_1258;
                                        local_12b8[0]._8_8_ = pcStack_1250;
                                        fmt_07.size_ = 0xdd;
                                        fmt_07.data_ = (char *)0x33;
                                        args_08.field_1.args_ = aVar21.args_;
                                        args_08.desc_ = (unsigned_long_long)local_12c8;
                                        ::fmt::v10::vformat_abi_cxx11_
                                                  ((string *)local_1368,
                                                   (v10 *)
                                                  "[mDNS] value of TXT Key \'bb\' is invalid: {} from {}"
                                                  ,fmt_07,args_08);
                                        local_1348._0_4_ = 8;
                                        pcStack_1340 = local_1338._M_local_buf + 8;
                                        std::__cxx11::string::_M_construct<char*>
                                                  ((string *)&pcStack_1340,local_1368._0_8_,
                                                   (char *)(local_1368._0_8_ +
                                                           CONCAT44(local_1368._12_4_,
                                                                    local_1368._8_4_)));
                                        *(undefined4 *)((long)aBorderAgent + 0x178) =
                                             local_1348._0_4_;
                                        std::__cxx11::string::operator=
                                                  (local_12e8,(string *)&pcStack_1340);
                                        pcVar9 = pcStack_1340;
                                        if (pcStack_1340 != local_1338._M_local_buf + 8)
                                        goto LAB_001f9167;
                                        goto LAB_001f916c;
                                      }
                                      uVar6 = utils::Decode<unsigned_short>(&local_12e0);
                                      *(unsigned_short *)((long)aBorderAgent + 0x142) = uVar6;
                                      *(byte *)((long)aBorderAgent + 0x171) =
                                           *(byte *)((long)aBorderAgent + 0x171) | 0x40;
                                    }
                                    goto LAB_001f95da;
                                  }
                                  if ((long)local_12e0.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_12e0.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start != 1) {
                                    ::fmt::v10::detail::
                                    check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                                              ();
                                    utils::Hex_abi_cxx11_
                                              (&local_1308,(utils *)&local_12e0,aBytes_03);
                                    local_12c8 = (undefined1  [8])local_1308._M_dataplus._M_p;
                                    pcStack_12c0 = (char *)local_1308._M_string_length;
                                    local_12b8[0]._M_allocated_capacity = local_1258;
                                    local_12b8[0]._8_8_ = pcStack_1250;
                                    fmt_06.size_ = 0xdd;
                                    fmt_06.data_ = (char *)0x33;
                                    args_07.field_1.args_ = aVar21.args_;
                                    args_07.desc_ = (unsigned_long_long)local_12c8;
                                    ::fmt::v10::vformat_abi_cxx11_
                                              ((string *)local_1368,
                                               (v10 *)
                                               "[mDNS] value of TXT Key \'sq\' is invalid: {} from {}"
                                               ,fmt_06,args_07);
                                    local_1348._0_4_ = 8;
                                    pcStack_1340 = local_1338._M_local_buf + 8;
                                    std::__cxx11::string::_M_construct<char*>
                                              ((string *)&pcStack_1340,local_1368._0_8_,
                                               (char *)(local_1368._0_8_ +
                                                       CONCAT44(local_1368._12_4_,local_1368._8_4_))
                                              );
                                    goto LAB_001f9289;
                                  }
                                  if (local_12e0.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish ==
                                      local_12e0.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start) {
                                    __assert_fail("condition",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/utils.hpp"
                                                  ,0xa2,
                                                  "T ot::commissioner::utils::Decode(const uint8_t *, size_t) [T = unsigned char]"
                                                 );
                                  }
                                  *(uchar *)((long)aBorderAgent + 0x140) =
                                       *local_12e0.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start;
                                  *(byte *)((long)aBorderAgent + 0x171) =
                                       *(byte *)((long)aBorderAgent + 0x171) | 0x20;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
LAB_001f95d7:
          bVar4 = true;
        }
LAB_001f95da:
        if (local_12e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (uint8_t *)0x0) {
          operator_delete(local_12e0.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1298._M_dataplus._M_p != &local_1298.field_2) {
          operator_delete(local_1298._M_dataplus._M_p);
        }
        if (local_1278.handler_ != (format_string_checker<char> *)local_1268) {
          operator_delete(local_1278.handler_);
        }
        if (!bVar4) goto LAB_001f9bfb;
        sVar22 = sVar22 + 1;
      } while (sVar22 != local_11e0);
    }
  }
  else {
    if (aType == 0x1c) {
      local_1278.handler_ = (format_string_checker<char> *)local_1268;
      local_1270 = 0;
      local_1268[0] = none_type;
      mdns_record_parse_aaaa(aData,aSize,aOffset,aLength,(sockaddr_in6 *)local_1368);
      local_1038._16_4_ = local_1358._M_allocated_capacity._0_4_;
      local_1038._20_4_ = (undefined4)local_1358._4_8_;
      lStack_1020._0_4_ = (undefined4)((ulong)local_1358._4_8_ >> 0x20);
      local_1038._0_8_ = local_1368._0_8_;
      local_1038._8_4_ = local_1368._8_4_;
      local_1038._12_4_ = local_1368._12_4_;
      Address::Set((Error *)local_1348,&local_1238,(sockaddr_storage *)local_1038);
      iVar7 = local_1348._0_4_;
      if (pcStack_1340 != local_1338._M_local_buf + 8) {
        operator_delete(pcStack_1340);
      }
      if (iVar7 != 0) {
        local_1348._0_4_ = 0xd;
        pcVar9 = "invalid IPv6 address in AAAA record from {}";
        pcStack_1340 = "invalid IPv6 address in AAAA record from {}";
        local_1338._M_allocated_capacity = 0x2b;
        local_1338._8_8_ = (char *)0x100000000;
        local_1320 = ::fmt::v10::detail::
                     parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
        ;
        local_1328 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_1348;
        local_1308._M_dataplus._M_p = (pointer)local_1348;
        do {
          cVar1 = *pcVar9;
          pcVar23 = pcVar9;
          while (cVar1 != '{') {
            pcVar23 = pcVar23 + 1;
            if (pcVar23 == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::writer::operator()((writer *)&local_1308,pcVar9,"");
              goto LAB_001f99af;
            }
            cVar1 = *pcVar23;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()((writer *)&local_1308,pcVar9,pcVar23);
          pcVar9 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (pcVar23,"",(format_string_checker<char> *)local_1348);
        } while (pcVar9 != "");
LAB_001f99af:
        local_1348 = (undefined1  [8])local_1258;
        pcStack_1340 = pcStack_1250;
        fmt_08.size_ = 0xd;
        fmt_08.data_ = (char *)0x2b;
        args_09.field_1.args_ = aVar21.args_;
        args_09.desc_ = (unsigned_long_long)local_1348;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_1298,(v10 *)"invalid IPv6 address in AAAA record from {}",fmt_08,args_09);
        local_12c8._0_4_ = 8;
        pcStack_12c0 = local_12b8[0]._M_local_buf + 8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pcStack_12c0,local_1298._M_dataplus._M_p,
                   (char *)(local_1298._M_string_length + (long)local_1298._M_dataplus._M_p));
        goto LAB_001f9aa4;
      }
      Address::ToString_abi_cxx11_((string *)local_1348,&local_1238);
      std::__cxx11::string::operator=((string *)&local_1278,(string *)local_1348);
      if (local_1348 != (undefined1  [8])&local_1338) {
        operator_delete((void *)local_1348);
      }
      std::__cxx11::string::_M_assign((string *)((long)aBorderAgent + 8));
LAB_001f9ba8:
      *(byte *)((long)aBorderAgent + 0x170) = *(byte *)((long)aBorderAgent + 0x170) | 1;
      goto LAB_001f9bb7;
    }
    if (aType == 0x21) {
      mdns_record_parse_srv
                ((mdns_record_srv_t *)local_1038,aData,aSize,aOffset,aLength,local_11b8,0x100);
      *(undefined2 *)((long)aBorderAgent + 0x28) = local_1038._4_2_;
      *(byte *)((long)aBorderAgent + 0x170) = *(byte *)((long)aBorderAgent + 0x170) | 2;
    }
  }
  if (*(int *)((long)aBorderAgent + 0x170) != 0) {
    tVar14 = time((time_t *)0x0);
    *(time_t *)((long)aBorderAgent + 0x168) = tVar14;
    *(byte *)((long)aBorderAgent + 0x172) = *(byte *)((long)aBorderAgent + 0x172) | 2;
  }
LAB_001f9bfb:
  if (local_11d8 != local_11c8) {
    operator_delete(local_11d8);
  }
  if (local_1258 != &local_1248) {
    operator_delete(local_1258);
  }
  if (local_1238.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1238.mBytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int HandleRecord(const struct sockaddr *aFrom,
                 mdns_entry_type_t      aEntry,
                 uint16_t               aType,
                 uint16_t               aRclass,
                 uint32_t               aTtl,
                 const void            *aData,
                 size_t                 aSize,
                 size_t                 aOffset,
                 size_t                 aLength,
                 void                  *aBorderAgent)
{
    struct sockaddr_storage fromAddrStorage;
    Address                 fromAddr;
    std::string             fromAddrStr;
    std::string             entryType;
    char                    nameBuffer[256];

    BorderAgentOrErrorMsg &borderAgentOrErrorMsg = *reinterpret_cast<BorderAgentOrErrorMsg *>(aBorderAgent);
    BorderAgent           &borderAgent           = borderAgentOrErrorMsg.mBorderAgent;
    Error                 &error                 = borderAgentOrErrorMsg.mError;

    (void)aRclass;
    (void)aTtl;

    *reinterpret_cast<struct sockaddr *>(&fromAddrStorage) = *aFrom;
    if (fromAddr.Set(fromAddrStorage) != ErrorCode::kNone)
    {
        ExitNow(error = ERROR_BAD_FORMAT("invalid source address of mDNS response"));
    }

    fromAddrStr = fromAddr.ToString();

    entryType = (aEntry == MDNS_ENTRYTYPE_ANSWER) ? "answer"
                                                  : ((aEntry == MDNS_ENTRYTYPE_AUTHORITY) ? "authority" : "additional");
    if (aType == MDNS_RECORDTYPE_PTR)
    {
        mdns_string_t nameStr = mdns_record_parse_ptr(aData, aSize, aOffset, aLength, nameBuffer, sizeof(nameBuffer));
        borderAgent.mServiceName  = std::string(nameStr.str, nameStr.length);
        borderAgent.mPresentFlags = BorderAgent::kServiceNameBit;
        // TODO(wgtdkp): add debug logging.
    }
    else if (aType == MDNS_RECORDTYPE_SRV)
    {
        mdns_record_srv_t server =
            mdns_record_parse_srv(aData, aSize, aOffset, aLength, nameBuffer, sizeof(nameBuffer));

        borderAgent.mPort = server.port;
        borderAgent.mPresentFlags |= BorderAgent::kPortBit;
    }
    else if (aType == MDNS_RECORDTYPE_A)
    {
        struct sockaddr_storage addrStorage;
        struct sockaddr_in      addr;
        std::string             addrStr;

        mdns_record_parse_a(aData, aSize, aOffset, aLength, &addr);

        *reinterpret_cast<struct sockaddr_in *>(&addrStorage) = addr;
        if (fromAddr.Set(addrStorage) != ErrorCode::kNone)
        {
            ExitNow(error = ERROR_BAD_FORMAT("invalid IPv4 address in A record from {}", fromAddrStr));
        }

        addrStr = fromAddr.ToString();

        // We prefer AAAA (IPv6) address than A (IPv4) address.
        if (!(borderAgent.mPresentFlags & BorderAgent::kAddrBit))
        {
            borderAgent.mAddr = addrStr;
            borderAgent.mPresentFlags |= BorderAgent::kAddrBit;
        }
    }
    else if (aType == MDNS_RECORDTYPE_AAAA)
    {
        struct sockaddr_storage addrStorage;
        struct sockaddr_in6     addr;
        std::string             addrStr;

        mdns_record_parse_aaaa(aData, aSize, aOffset, aLength, &addr);

        *reinterpret_cast<struct sockaddr_in6 *>(&addrStorage) = addr;
        if (fromAddr.Set(addrStorage) != ErrorCode::kNone)
        {
            ExitNow(error = ERROR_BAD_FORMAT("invalid IPv6 address in AAAA record from {}", fromAddrStr));
        }

        addrStr = fromAddr.ToString();

        borderAgent.mAddr = addrStr;
        borderAgent.mPresentFlags |= BorderAgent::kAddrBit;
    }
    else if (aType == MDNS_RECORDTYPE_TXT)
    {
        mdns_record_txt_t txtBuffer[128];
        size_t            parsed;

        parsed = mdns_record_parse_txt(aData, aSize, aOffset, aLength, txtBuffer,
                                       sizeof(txtBuffer) / sizeof(mdns_record_txt_t));

        for (size_t i = 0; i < parsed; ++i)
        {
            auto key         = ToString(txtBuffer[i].key);
            auto value       = ToString(txtBuffer[i].value);
            auto binaryValue = ToByteArray(txtBuffer[i].value);

            if (key == "rv")
            {
                VerifyOrExit(value == "1", error = ERROR_BAD_FORMAT("value of TXT Key 'rv' is {} but not 1 from {}",
                                                                    value, fromAddrStr));
            }
            else if (key == "dd")
            {
                auto &discriminator = binaryValue;

                if (discriminator.size() != kExtendedAddrLength)
                {
                    ExitNow(error = ERROR_BAD_FORMAT("value of TXT Key 'dd' is invalid: value={}",
                                                     utils::Hex(discriminator)));
                }
                else
                {
                    borderAgent.mDiscriminator = discriminator;
                    borderAgent.mPresentFlags |= BorderAgent::kDiscriminatorBit;
                }
            }
            else if (key == "tv")
            {
                borderAgent.mThreadVersion = value;
                borderAgent.mPresentFlags |= BorderAgent::kThreadVersionBit;
            }
            else if (key == "sb")
            {
                auto &bitmap = binaryValue;
                if (bitmap.size() != 4)
                {
                    ExitNow(error = ERROR_BAD_FORMAT("value of TXT Key 'sb' is invalid: value={} from {}",
                                                     utils::Hex(bitmap), fromAddrStr));
                }

                borderAgent.mState.mConnectionMode = (bitmap[3] & 0x07);
                borderAgent.mState.mThreadIfStatus = (bitmap[3] & 0x18) >> 3;
                borderAgent.mState.mAvailability   = (bitmap[3] & 0x60) >> 5;
                borderAgent.mState.mBbrIsActive    = (bitmap[3] & 0x80) >> 7;
                borderAgent.mState.mBbrIsPrimary   = (bitmap[2] & 0x01);
                borderAgent.mPresentFlags |= BorderAgent::kStateBit;
            }
            else if (key == "nn")
            {
                borderAgent.mNetworkName = value;
                borderAgent.mPresentFlags |= BorderAgent::kNetworkNameBit;
            }
            else if (key == "xp")
            {
                auto &extendPanId = binaryValue;
                if (extendPanId.size() != 8)
                {
                    ExitNow(error = ERROR_BAD_FORMAT("value of TXT Key 'xp' is invalid: value={} from {}",
                                                     utils::Hex(extendPanId), fromAddrStr));
                }
                else
                {
                    borderAgent.mExtendedPanId = utils::Decode<uint64_t>(extendPanId);
                    borderAgent.mPresentFlags |= BorderAgent::kExtendedPanIdBit;
                }
            }
            else if (key == "vn")
            {
                borderAgent.mVendorName = value;
                borderAgent.mPresentFlags |= BorderAgent::kVendorNameBit;
            }
            else if (key == "mn")
            {
                borderAgent.mModelName = value;
                borderAgent.mPresentFlags |= BorderAgent::kModelNameBit;
            }
            else if (key == "at")
            {
                auto &activeTimestamp = binaryValue;
                if (activeTimestamp.size() != 8)
                {
                    ExitNow(error = ERROR_BAD_FORMAT("value of TXT Key 'at' is invalid: value={} from {}",
                                                     utils::Hex(activeTimestamp), fromAddrStr));
                }
                else
                {
                    borderAgent.mActiveTimestamp = Timestamp::Decode(utils::Decode<uint64_t>(activeTimestamp));
                    borderAgent.mPresentFlags |= BorderAgent::kActiveTimestampBit;
                }
            }
            else if (key == "pt")
            {
                auto &partitionId = binaryValue;
                if (partitionId.size() != 4)
                {
                    ExitNow(error = ERROR_BAD_FORMAT("value of TXT Key 'pt' is invalid: value={} from {}",
                                                     utils::Hex(partitionId), fromAddrStr));
                }
                else
                {
                    borderAgent.mPartitionId = utils::Decode<uint32_t>(partitionId);
                    borderAgent.mPresentFlags |= BorderAgent::kPartitionIdBit;
                }
            }
            else if (key == "vd")
            {
                borderAgent.mVendorData = value;
                borderAgent.mPresentFlags |= BorderAgent::kVendorDataBit;
            }
            else if (key == "vo")
            {
                auto &oui = binaryValue;
                if (oui.size() != 3)
                {
                    ExitNow(error = ERROR_BAD_FORMAT("value of TXT Key 'vo' is invalid: value={} from {}",
                                                     utils::Hex(oui), fromAddrStr));
                }
                else
                {
                    borderAgent.mVendorOui = oui;
                    borderAgent.mPresentFlags |= BorderAgent::kVendorOuiBit;
                }
            }
            else if (key == "dn")
            {
                borderAgent.mDomainName = value;
                borderAgent.mPresentFlags |= BorderAgent::kDomainNameBit;
            }
            else if (key == "sq")
            {
                auto &bbrSeqNum = binaryValue;
                if (bbrSeqNum.size() != 1)
                {
                    ExitNow(error = ERROR_BAD_FORMAT("[mDNS] value of TXT Key 'sq' is invalid: {} from {}",
                                                     utils::Hex(bbrSeqNum), fromAddrStr));
                }
                else
                {
                    borderAgent.mBbrSeqNumber = utils::Decode<uint8_t>(bbrSeqNum);
                    borderAgent.mPresentFlags |= BorderAgent::kBbrSeqNumberBit;
                }
            }
            else if (key == "bb")
            {
                auto &bbrPort = binaryValue;
                if (bbrPort.size() != 2)
                {
                    ExitNow(error = ERROR_BAD_FORMAT("[mDNS] value of TXT Key 'bb' is invalid: {} from {}",
                                                     utils::Hex(bbrPort), fromAddrStr));
                }
                else
                {
                    borderAgent.mBbrPort = utils::Decode<uint16_t>(bbrPort);
                    borderAgent.mPresentFlags |= BorderAgent::kBbrPortBit;
                }
            }
            else
            {
                // TODO(wgtdkp): add debug logging.
            }
        }
    }
    else
    {
        // TODO(wgtdkp): add debug logging.
    }

    if (borderAgent.mPresentFlags != 0)
    {
        // Actualize Timestamp
        borderAgent.mUpdateTimestamp.mTime = time(nullptr);
        borderAgent.mPresentFlags |= BorderAgent::kUpdateTimestampBit;
    }
exit:
    return 0;
}